

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

format_arg *
fmt::v7::detail::
get_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,fmt::v7::basic_string_view<char>>
          (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx,
          basic_string_view<char> id)

{
  basic_string_view<char> name;
  bool bVar1;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *in_RCX;
  size_t in_RDX;
  char *in_RSI;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *in_RDI;
  format_arg *arg;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *this;
  
  name.size_ = in_RDX;
  name.data_ = in_RSI;
  this = in_RDI;
  basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::arg(in_RCX,name);
  bVar1 = basic_format_arg::operator_cast_to_bool((basic_format_arg *)this);
  if (!bVar1) {
    basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>::on_error
              (this,(char *)in_RDI);
  }
  return (format_arg *)in_RDI;
}

Assistant:

FMT_CONSTEXPR typename Context::format_arg get_arg(Context& ctx, ID id) {
  auto arg = ctx.arg(id);
  if (!arg) ctx.on_error("argument not found");
  return arg;
}